

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConstraintBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConstraintBlockSyntax,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::ConstraintItemSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,SyntaxList<slang::syntax::ConstraintItemSyntax> *args_1,
          Token *args_2)

{
  size_type sVar1;
  pointer ppCVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  SyntaxKind SVar9;
  undefined4 uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  ConstraintBlockSyntax *pCVar15;
  long lVar16;
  
  pCVar15 = (ConstraintBlockSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConstraintBlockSyntax *)this->endPtr < pCVar15 + 1) {
    pCVar15 = (ConstraintBlockSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pCVar15 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar3 = args->info;
  TVar11 = args_2->kind;
  uVar12 = args_2->field_0x2;
  NVar13.raw = (args_2->numFlags).raw;
  uVar14 = args_2->rawLen;
  pIVar4 = args_2->info;
  (pCVar15->super_ConstraintItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar15->super_ConstraintItemSyntax).super_SyntaxNode.kind = ConstraintBlock;
  (pCVar15->openBrace).kind = TVar5;
  (pCVar15->openBrace).field_0x2 = uVar6;
  (pCVar15->openBrace).numFlags = (NumericTokenFlags)NVar7.raw;
  (pCVar15->openBrace).rawLen = uVar8;
  (pCVar15->openBrace).info = pIVar3;
  SVar9 = (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar10 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pCVar15->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar15->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar9;
  *(undefined4 *)&(pCVar15->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar10;
  (pCVar15->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pCVar15->items).super_SyntaxListBase.childCount = (args_1->super_SyntaxListBase).childCount;
  sVar1 = (args_1->super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>).size_;
  (pCVar15->items).super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>.data_ =
       (args_1->super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>).data_;
  (pCVar15->items).super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>.size_ =
       sVar1;
  (pCVar15->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0050b2b0;
  (pCVar15->closeBrace).kind = TVar11;
  (pCVar15->closeBrace).field_0x2 = uVar12;
  (pCVar15->closeBrace).numFlags = (NumericTokenFlags)NVar13.raw;
  (pCVar15->closeBrace).rawLen = uVar14;
  (pCVar15->closeBrace).info = pIVar4;
  (pCVar15->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pCVar15;
  sVar1 = (pCVar15->items).super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>
          .size_;
  if (sVar1 != 0) {
    ppCVar2 = (pCVar15->items).
              super_span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL>.data_;
    lVar16 = 0;
    do {
      **(undefined8 **)((long)ppCVar2 + lVar16) = pCVar15;
      lVar16 = lVar16 + 8;
    } while (sVar1 << 3 != lVar16);
  }
  return pCVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }